

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize_parse_info.cpp
# Opt level: O1

void __thiscall
duckdb::AlterForeignKeyInfo::Serialize(AlterForeignKeyInfo *this,Serializer *serializer)

{
  AlterTableInfo::Serialize(&this->super_AlterTableInfo,serializer);
  Serializer::WritePropertyWithDefault<std::__cxx11::string>
            (serializer,400,"fk_table",&this->fk_table);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x191,"pk_columns",&this->pk_columns);
  Serializer::WritePropertyWithDefault<duckdb::vector<std::__cxx11::string,true>>
            (serializer,0x192,"fk_columns",&this->fk_columns);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0x193,"pk_keys",&this->pk_keys);
  Serializer::WritePropertyWithDefault<duckdb::vector<duckdb::PhysicalIndex,true>>
            (serializer,0x194,"fk_keys",&this->fk_keys);
  (*serializer->_vptr_Serializer[2])(serializer,0x195,"alter_fk_type");
  Serializer::WriteValue<duckdb::AlterForeignKeyType>(serializer,this->type);
  (*serializer->_vptr_Serializer[3])(serializer);
  return;
}

Assistant:

void AlterForeignKeyInfo::Serialize(Serializer &serializer) const {
	AlterTableInfo::Serialize(serializer);
	serializer.WritePropertyWithDefault<string>(400, "fk_table", fk_table);
	serializer.WritePropertyWithDefault<vector<string>>(401, "pk_columns", pk_columns);
	serializer.WritePropertyWithDefault<vector<string>>(402, "fk_columns", fk_columns);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(403, "pk_keys", pk_keys);
	serializer.WritePropertyWithDefault<vector<PhysicalIndex>>(404, "fk_keys", fk_keys);
	serializer.WriteProperty<AlterForeignKeyType>(405, "alter_fk_type", type);
}